

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILBDOperator.cpp
# Opt level: O1

void __thiscall lts2::LBDOperator::Apply(LBDOperator *this,Mat *X,Mat *Ax)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  BasisFunction *pBVar4;
  IntegratingCell *pIVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  _InputArray local_68;
  undefined8 uStack_50;
  _InputArray local_48;
  
  cv::Mat::create((int)Ax,*(int *)&(this->super_LinearOperator).field_0xc,1);
  local_68.sz.width = 0;
  local_68.sz.height = 0;
  uStack_50 = 0;
  local_68.flags = 0;
  local_68._4_4_ = 0;
  local_68.obj = (void *)0x0;
  local_48.flags = -0x3efdfffa;
  local_48.sz.width = 1;
  local_48.sz.height = 4;
  local_48.obj = &local_68;
  cv::noArray();
  cv::Mat::setTo((_InputArray *)Ax,&local_48);
  if (*(long *)&this->field_0x28 != 0) {
    local_68.sz.width = 0;
    local_68.sz.height = 0;
    uStack_50 = 0;
    local_68.flags = 0;
    local_68._4_4_ = 0;
    local_68.obj = (void *)0x0;
    local_48.flags = -0x3efdfffa;
    local_48.sz.width = 1;
    local_48.sz.height = 4;
    local_48.obj = &local_68;
    cv::noArray();
    cv::Mat::setTo((_InputArray *)&this->_integralImage,&local_48);
  }
  local_68.sz.width = 0;
  local_68.sz.height = 0;
  local_68.flags = 0x1010000;
  local_48.sz.width = 0;
  local_48.sz.height = 0;
  local_48.flags = 0x2010000;
  local_68.obj = X;
  local_48.obj = &this->_integralImage;
  cv::integral(&local_68,(_OutputArray *)&local_48,6);
  uVar8 = (ulong)*(uint *)&(this->super_LinearOperator).field_0xc;
  if (uVar8 != 0) {
    lVar3 = *(long *)(Ax + 0x10);
    pBVar4 = this->_basisFunctions;
    pIVar5 = this->_sensitiveCells;
    lVar6 = *(long *)&this->field_0x28;
    lVar7 = **(long **)&this->field_0x60;
    uVar9 = 0;
    do {
      uVar1 = pBVar4[uVar9].pos_cell;
      lVar10 = pIVar5[(int)uVar1].ymin * lVar7 + lVar6;
      lVar12 = pIVar5[(int)uVar1].ymax * lVar7 + lVar6;
      uVar2 = pBVar4[uVar9].neg_cell;
      lVar11 = pIVar5[(int)uVar2].ymin * lVar7 + lVar6;
      lVar13 = pIVar5[(int)uVar2].ymax * lVar7 + lVar6;
      *(float *)(lVar3 + uVar9 * 4) =
           (float)((((*(double *)(lVar10 + (long)pIVar5[(int)uVar1].xmin * 8) +
                     *(double *)(lVar12 + (long)pIVar5[(int)uVar1].xmax * 8)) -
                    *(double *)(lVar10 + (long)pIVar5[(int)uVar1].xmax * 8)) -
                   *(double *)(lVar12 + (long)pIVar5[(int)uVar1].xmin * 8)) *
                   pIVar5[(int)uVar1].scaleFactor -
                  (((*(double *)(lVar11 + (long)pIVar5[(int)uVar2].xmin * 8) +
                    *(double *)(lVar13 + (long)pIVar5[(int)uVar2].xmax * 8)) -
                   *(double *)(lVar11 + (long)pIVar5[(int)uVar2].xmax * 8)) -
                  *(double *)(lVar13 + (long)pIVar5[(int)uVar2].xmin * 8)) *
                  pIVar5[(int)uVar2].scaleFactor);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  return;
}

Assistant:

void lts2::LBDOperator::Apply(cv::Mat const& X, cv::Mat& Ax)
{
    // Create a column vector where rows = number_of_active_pairs
    Ax.create(_pairsInUse, 1, CV_32FC1);
    Ax.setTo(cv::Scalar(0));

    // Compute the integral image for later
    if (_integralImage.data)
        _integralImage.setTo(cv::Scalar(0));
    cv::integral(X, _integralImage, CV_64F);
    
    // Apply each pair
    float* p_ax = Ax.ptr<float>(0);
    for (int i = 0; i < _pairsInUse; ++i)
    {
        double mes_pos = measureAtCell(_basisFunctions[i].pos_cell);
        double mes_neg = measureAtCell(_basisFunctions[i].neg_cell);
        
        *p_ax++ = cv::saturate_cast<float>(mes_pos - mes_neg);
    }
    
}